

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staleblock.cc
# Opt level: O3

void fdb_gather_stale_blocks
               (fdb_kvs_handle *handle,filemgr_header_revnum_t revnum,bid_t prev_hdr,
               uint64_t kv_info_offset,fdb_seqnum_t seqnum,list_elem *e_last,bool from_mergetree)

{
  char *__s;
  uint uVar1;
  btreeblk_handle *pbVar2;
  avl_node *paVar3;
  list_elem *plVar4;
  list *list;
  docio_handle *handle_00;
  btree *btree;
  fdb_kvs_handle *handle_01;
  filemgr *pfVar5;
  filemgr_header_revnum_t revnum_00;
  ulong *__ptr;
  ulong uVar6;
  avl_node *node;
  list_elem **pplVar7;
  list_elem *e;
  size_t sVar8;
  bid_t doc_offset;
  byte bVar9;
  undefined7 uVar11;
  long lVar10;
  ulong uVar12;
  char *pcVar13;
  bid_t bVar14;
  undefined8 auStack_120 [4];
  undefined8 uStack_100;
  undefined1 auStack_f8 [8];
  undefined1 local_f0 [8];
  kvs_stat stat;
  ulong local_78;
  filemgr_header_revnum_t _revnum;
  list_elem **local_68;
  ulong local_60;
  bid_t _doc_offset;
  list_elem *local_50;
  undefined4 local_44;
  ulong local_40;
  uint local_38;
  byte local_31;
  
  if (handle->file->stale_list == (list *)0x0) {
    btreeblk_reset_subblock_info(handle->bhandle);
    return;
  }
  local_31 = from_mergetree;
  _doc_offset = (bid_t)handle;
  local_50 = e_last;
  _kvs_stat_get(handle->file,0,(kvs_stat *)local_f0);
  pbVar2 = handle->bhandle;
  pbVar2->nlivenodes = (int64_t)local_f0;
  pbVar2->ndeltanodes = (int64_t)local_f0;
  __ptr = (ulong *)calloc(1,0x2000);
  local_78 = revnum >> 0x38 | (revnum & 0xff000000000000) >> 0x28 |
             (revnum & 0xff0000000000) >> 0x18 | (revnum & 0xff00000000) >> 8 |
             (revnum & 0xff000000) << 8 | (revnum & 0xff0000) << 0x18 | (revnum & 0xff00) << 0x28 |
             revnum << 0x38;
  uVar6 = 0xffffffffffffffff;
  if (1 < prev_hdr + 1) {
    uVar6 = prev_hdr >> 0x38 | (prev_hdr & 0xff000000000000) >> 0x28 |
            (prev_hdr & 0xff0000000000) >> 0x18 | (prev_hdr & 0xff00000000) >> 8 |
            (prev_hdr & 0xff000000) << 8 | (prev_hdr & 0xff0000) << 0x18 |
            (prev_hdr & 0xff00) << 0x28 | prev_hdr << 0x38;
  }
  *__ptr = 0xffffffffffffffff;
  __ptr[1] = uVar6;
  __ptr[2] = kv_info_offset >> 0x38 | (kv_info_offset & 0xff000000000000) >> 0x28 |
             (kv_info_offset & 0xff0000000000) >> 0x18 | (kv_info_offset & 0xff00000000) >> 8 |
             (kv_info_offset & 0xff000000) << 8 | (kv_info_offset & 0xff0000) << 0x18 |
             (kv_info_offset & 0xff00) << 0x28 | kv_info_offset << 0x38;
  __ptr[3] = seqnum >> 0x38 | (seqnum & 0xff000000000000) >> 0x28 |
             (seqnum & 0xff0000000000) >> 0x18 | (seqnum & 0xff00000000) >> 8 |
             (seqnum & 0xff000000) << 8 | (seqnum & 0xff0000) << 0x18 | (seqnum & 0xff00) << 0x28 |
             seqnum << 0x38;
  local_68 = &local_50->next;
  uVar11 = (undefined7)((ulong)&local_78 >> 8);
  bVar9 = 1;
  pcVar13 = auStack_f8;
  bVar14 = _doc_offset;
  uVar6 = 0x2000;
  _revnum = revnum;
  do {
    local_44 = (undefined4)CONCAT71(uVar11,bVar9 & local_31);
    if ((bVar9 & local_31) == 1) {
      lVar10 = *(long *)(bVar14 + 0x48);
      pcVar13[-8] = -0x6f;
      pcVar13[-7] = '\n';
      pcVar13[-6] = '\x14';
      pcVar13[-5] = '\0';
      pcVar13[-4] = '\0';
      pcVar13[-3] = '\0';
      pcVar13[-2] = '\0';
      pcVar13[-1] = '\0';
      node = avl_first((avl_tree *)(lVar10 + 0x298));
      if (node == (avl_node *)0x0) {
LAB_00140ccc:
        pfVar5 = *(filemgr **)(bVar14 + 0x48);
        lVar10 = *(long *)(*(long *)(bVar14 + 0x58) + 8) - (long)local_f0;
        pcVar13[-8] = -0x16;
        pcVar13[-7] = '\f';
        pcVar13[-6] = '\x14';
        pcVar13[-5] = '\0';
        pcVar13[-4] = '\0';
        pcVar13[-3] = '\0';
        pcVar13[-2] = '\0';
        pcVar13[-1] = '\0';
        _kvs_stat_update_attr(pfVar5,0,KVS_STAT_NLIVENODES,lVar10);
        pfVar5 = *(filemgr **)(bVar14 + 0x48);
        lVar10 = *(long *)(*(long *)(bVar14 + 0x58) + 0x10);
        uVar1 = *(uint *)(bVar14 + 0x74);
        builtin_strncpy(pcVar13 + -8,"\x14\r\x14",4);
        pcVar13[-4] = '\0';
        pcVar13[-3] = '\0';
        pcVar13[-2] = '\0';
        pcVar13[-1] = '\0';
        _kvs_stat_update_attr(pfVar5,0,KVS_STAT_DELTASIZE,(ulong)uVar1 * (lVar10 - (long)local_f0));
        builtin_strncpy(pcVar13 + -8,"\x1c\r\x14",4);
        pcVar13[-4] = '\0';
        pcVar13[-3] = '\0';
        pcVar13[-2] = '\0';
        pcVar13[-1] = '\0';
        free(__ptr);
        return;
      }
      uVar12 = 0x24;
      local_38 = 0;
      do {
        if (*(long *)(bVar14 + 0x38) != 0) {
          local_38 = local_38 + 1;
          paVar3 = node[-1].left;
          uVar1 = *(uint *)&node[-1].right;
          *(ulong *)((long)__ptr + uVar12) =
               (ulong)paVar3 >> 0x38 | ((ulong)paVar3 & 0xff000000000000) >> 0x28 |
               ((ulong)paVar3 & 0xff0000000000) >> 0x18 | ((ulong)paVar3 & 0xff00000000) >> 8 |
               ((ulong)paVar3 & 0xff000000) << 8 | ((ulong)paVar3 & 0xff0000) << 0x18 |
               ((ulong)paVar3 & 0xff00) << 0x28 | (long)paVar3 << 0x38;
          *(uint *)((long)__ptr + (ulong)((int)uVar12 + 8)) =
               uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
          uVar12 = (ulong)((int)uVar12 + 0xc);
          if ((uVar6 & 0xffffffff) <= uVar12 + 0xc) {
            uVar6 = (ulong)(uint)((int)uVar6 * 2);
            pcVar13[-8] = -0x15;
            pcVar13[-7] = '\n';
            pcVar13[-6] = '\x14';
            pcVar13[-5] = '\0';
            pcVar13[-4] = '\0';
            pcVar13[-3] = '\0';
            pcVar13[-2] = '\0';
            pcVar13[-1] = '\0';
            __ptr = (ulong *)realloc(__ptr,uVar6);
          }
        }
        pcVar13[-8] = -10;
        pcVar13[-7] = '\n';
        pcVar13[-6] = '\x14';
        pcVar13[-5] = '\0';
        pcVar13[-4] = '\0';
        pcVar13[-3] = '\0';
        pcVar13[-2] = '\0';
        pcVar13[-1] = '\0';
        node = avl_next(node);
      } while (node != (avl_node *)0x0);
    }
    else {
      pplVar7 = local_68;
      if (local_50 == (list_elem *)0x0) {
        pplVar7 = *(list_elem ***)(*(long *)(bVar14 + 0x48) + 0x280);
      }
      e = *pplVar7;
      if (e == (list_elem *)0x0) goto LAB_00140ccc;
      local_40 = 0x24;
      local_38 = 0;
      do {
        if (*(long *)(bVar14 + 0x38) != 0) {
          local_38 = local_38 + 1;
          plVar4 = e[-1].prev;
          uVar1 = *(uint *)&e[-1].next;
          *(ulong *)((long)__ptr + (local_40 & 0xffffffff)) =
               (ulong)plVar4 >> 0x38 | ((ulong)plVar4 & 0xff000000000000) >> 0x28 |
               ((ulong)plVar4 & 0xff0000000000) >> 0x18 | ((ulong)plVar4 & 0xff00000000) >> 8 |
               ((ulong)plVar4 & 0xff000000) << 8 | ((ulong)plVar4 & 0xff0000) << 0x18 |
               ((ulong)plVar4 & 0xff00) << 0x28 | (long)plVar4 << 0x38;
          *(uint *)((long)__ptr + (ulong)((int)local_40 + 8)) =
               uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
          local_40 = (ulong)((int)local_40 + 0xc);
          if ((uVar6 & 0xffffffff) <= local_40 + 0xc) {
            uVar6 = (ulong)(uint)((int)uVar6 * 2);
            builtin_strncpy(pcVar13 + -8,"{\v\x14",4);
            pcVar13[-4] = '\0';
            pcVar13[-3] = '\0';
            pcVar13[-2] = '\0';
            pcVar13[-1] = '\0';
            __ptr = (ulong *)realloc(__ptr,uVar6);
          }
        }
        bVar14 = _doc_offset;
        plVar4 = e + -1;
        list = *(list **)(*(long *)(_doc_offset + 0x48) + 0x280);
        pcVar13[-8] = -0x5a;
        pcVar13[-7] = '\v';
        pcVar13[-6] = '\x14';
        pcVar13[-5] = '\0';
        pcVar13[-4] = '\0';
        pcVar13[-3] = '\0';
        pcVar13[-2] = '\0';
        pcVar13[-1] = '\0';
        e = list_remove(list,e);
        pcVar13[-8] = -0x4f;
        pcVar13[-7] = '\v';
        pcVar13[-6] = '\x14';
        pcVar13[-5] = '\0';
        pcVar13[-4] = '\0';
        pcVar13[-3] = '\0';
        pcVar13[-2] = '\0';
        pcVar13[-1] = '\0';
        free(plVar4);
        uVar12 = local_40;
      } while (e != (list_elem *)0x0);
    }
    revnum_00 = _revnum;
    if (local_38 == 0) goto LAB_00140ccc;
    __s = pcVar13 + -0x20;
    *(uint *)(__ptr + 4) =
         local_38 >> 0x18 | (local_38 & 0xff0000) >> 8 | (local_38 & 0xff00) << 8 | local_38 << 0x18
    ;
    stat.deltasize = 0;
    builtin_strncpy(pcVar13 + -0x28,"\x17\f\x14",4);
    pcVar13[-0x24] = '\0';
    pcVar13[-0x23] = '\0';
    pcVar13[-0x22] = '\0';
    pcVar13[-0x21] = '\0';
    local_40 = uVar6;
    sprintf(__s,"stale_blocks_%lu",_revnum);
    builtin_strncpy(pcVar13 + -0x28,"*\f\x14",4);
    pcVar13[-0x24] = '\0';
    pcVar13[-0x23] = '\0';
    pcVar13[-0x22] = '\0';
    pcVar13[-0x21] = '\0';
    sVar8 = strlen(__s);
    stat.deltasize = CONCAT44((int)uVar12,CONCAT22(0,(short)sVar8 + 1));
    handle_00 = *(docio_handle **)(bVar14 + 0x50);
    builtin_strncpy(pcVar13 + -0x28,"_\f\x14",4);
    pcVar13[-0x24] = '\0';
    pcVar13[-0x23] = '\0';
    pcVar13[-0x22] = '\0';
    pcVar13[-0x21] = '\0';
    doc_offset = docio_append_doc_system(handle_00,(docio_object *)&stat.deltasize);
    local_60 = doc_offset >> 0x38 | (doc_offset & 0xff000000000000) >> 0x28 |
               (doc_offset & 0xff0000000000) >> 0x18 | (doc_offset & 0xff00000000) >> 8 |
               (doc_offset & 0xff000000) << 8 | (doc_offset & 0xff0000) << 0x18 |
               (doc_offset & 0xff00) << 0x28 | doc_offset << 0x38;
    btree = *(btree **)(bVar14 + 0x38);
    builtin_strncpy(pcVar13 + -0x28,"{\f\x14",4);
    pcVar13[-0x24] = '\0';
    pcVar13[-0x23] = '\0';
    pcVar13[-0x22] = '\0';
    pcVar13[-0x21] = '\0';
    btree_insert(btree,&local_78,&local_60);
    pbVar2 = *(btreeblk_handle **)(bVar14 + 0x58);
    pcVar13[-0x28] = -0x7b;
    pcVar13[-0x27] = '\f';
    pcVar13[-0x26] = '\x14';
    pcVar13[-0x25] = '\0';
    pcVar13[-0x24] = '\0';
    pcVar13[-0x23] = '\0';
    pcVar13[-0x22] = '\0';
    pcVar13[-0x21] = '\0';
    btreeblk_end(pbVar2);
    pbVar2 = *(btreeblk_handle **)(bVar14 + 0x58);
    pcVar13[-0x28] = -0x71;
    pcVar13[-0x27] = '\f';
    pcVar13[-0x26] = '\x14';
    pcVar13[-0x25] = '\0';
    pcVar13[-0x24] = '\0';
    pcVar13[-0x23] = '\0';
    pcVar13[-0x22] = '\0';
    pcVar13[-0x21] = '\0';
    btreeblk_reset_subblock_info(pbVar2);
    handle_01 = *(fdb_kvs_handle **)(bVar14 + 0x48);
    pcVar13[-0x28] = -0x59;
    pcVar13[-0x27] = '\f';
    pcVar13[-0x26] = '\x14';
    pcVar13[-0x25] = '\0';
    pcVar13[-0x24] = '\0';
    pcVar13[-0x23] = '\0';
    pcVar13[-0x22] = '\0';
    pcVar13[-0x21] = '\0';
    fdb_add_inmem_stale_info
              (handle_01,revnum_00,(docio_object *)&stat.deltasize,doc_offset,local_44._0_1_);
    pcVar13 = __s;
    if (**(long **)(*(long *)(bVar14 + 0x48) + 0x280) == 0) goto LAB_00140ccc;
    *__ptr = local_60;
    bVar9 = 0;
    uVar11 = 0;
    uVar6 = local_40;
  } while( true );
}

Assistant:

void fdb_gather_stale_blocks(fdb_kvs_handle *handle,
                             filemgr_header_revnum_t revnum,
                             bid_t prev_hdr,
                             uint64_t kv_info_offset,
                             fdb_seqnum_t seqnum,
                             struct list_elem *e_last,
                             bool from_mergetree)
{
    int64_t delta;
    int r;
    uint32_t count = 0;
    uint32_t offset = 0, count_location;
    uint32_t bufsize = 8192;
    uint32_t _count, _len;
    uint64_t _pos, _kv_info_offset;
    uint8_t *buf = NULL;
    bid_t doc_offset, _doc_offset;
    bid_t _prev_hdr;
    bool gather_staleblocks = true;
    bool first_loop = true;
    filemgr_header_revnum_t _revnum;
    fdb_seqnum_t _seqnum;
    struct kvs_stat stat;

    /*
     * << stale block system doc structure >>
     * [previous doc offset]: 8 bytes (0xffff.. if not exist)
     * [previous header BID]: 8 bytes (0xffff.. if not exist)
     * [KVS info doc offset]: 8 bytes (0xffff.. if not exist)
     * [Default KVS seqnum]:  8 bytes
     * [# items]:             4 bytes
     * ---
     * [position]:            8 bytes
     * [length]:              4 bytes
     * ...
     */

    if (filemgr_get_stale_list(handle->file)) {
        struct avl_node *a;
        struct list_elem *e;
        struct stale_data *item;

        r = _kvs_stat_get(handle->file, 0, &stat);
        handle->bhandle->nlivenodes = stat.nlivenodes;
        handle->bhandle->ndeltanodes = stat.nlivenodes;
        (void)r;

        buf = (uint8_t *)calloc(1, bufsize);
        _revnum = _endian_encode(revnum);

        // initial previous doc offset
        memset(buf, 0xff, sizeof(bid_t));
        count_location = sizeof(bid_t);

        // previous header BID
        if (prev_hdr == 0 || prev_hdr == BLK_NOT_FOUND) {
            // does not exist
            memset(&_prev_hdr, 0xff, sizeof(_prev_hdr));
        } else {
            _prev_hdr = _endian_encode(prev_hdr);
        }
        memcpy(buf + sizeof(bid_t), &_prev_hdr, sizeof(bid_t));
        count_location += sizeof(bid_t);

        // KVS info doc offset
        _kv_info_offset = _endian_encode(kv_info_offset);
        memcpy(buf + count_location, &_kv_info_offset, sizeof(uint64_t));
        count_location += sizeof(uint64_t);

        // default KVS seqnum
        _seqnum = _endian_encode(seqnum);
        memcpy(buf + count_location, &_seqnum, sizeof(fdb_seqnum_t));
        count_location += sizeof(fdb_seqnum_t);
        count_location += sizeof(count);

        while(gather_staleblocks) {
            // reserve space for
            // prev offset (8), prev header (8), kv_info_offset (8),
            // seqnum (8), count (4)
            offset = count_location;

            if (first_loop && from_mergetree) {
                // gather from mergetree
                a = avl_first(&handle->file->mergetree);
                while (a) {
                    item = _get_entry(a, struct stale_data, avl);

                    if (handle->staletree) {
                        count++;

                        _pos = _endian_encode(item->pos);
                        _len = _endian_encode(item->len);

                        memcpy(buf + offset, &_pos, sizeof(_pos));
                        offset += sizeof(_pos);
                        memcpy(buf + offset, &_len, sizeof(_len));
                        offset += sizeof(_len);

                        if (offset + sizeof(_pos) + sizeof(_len) >= bufsize) {
                            bufsize *= 2;
                            buf = (uint8_t*)realloc(buf, bufsize);
                        }
                    }


                    // If 'from_mergetree' flag is set, it means that this
                    // function is called at the end of fdb_get_reusable_block(),
                    // and those items are remaining (non-reusable) regions after
                    // picking up reusable blocks from 'mergetree'.

                    // In the previous implementation, those items are converted
                    // and stored as a system document. The document is re-read in
                    // the next block reclaim, and then we reconstruct 'mergetree'
                    // from the document; this is unnecessary duplicated overhead.

                    // As an optimization, we can simply keep those items in
                    // 'mergetree' and use them in the next block reclaim, without
                    // reading the corresponding system document; this also reduces
                    // the commit latency much. Instead, to minimize memory
                    // consumption, we don't need to maintain in-memory copy of the
                    // system doc corresponding to the remaining items in the
                    // 'mergetree', that will be created below.

                    // do not remove the item
                    a = avl_next(&item->avl);
                }
            } else {
                // gater from stale_list
                if (e_last) {
                    e = list_next(e_last);
                } else {
                    e = list_begin(handle->file->stale_list);
                }
                while (e) {
                    item = _get_entry(e, struct stale_data, le);

                    if (handle->staletree) {
                        count++;

                        _pos = _endian_encode(item->pos);
                        _len = _endian_encode(item->len);

                        memcpy(buf + offset, &_pos, sizeof(_pos));
                        offset += sizeof(_pos);
                        memcpy(buf + offset, &_len, sizeof(_len));
                        offset += sizeof(_len);

                        if (offset + sizeof(_pos) + sizeof(_len) >= bufsize) {
                            bufsize *= 2;
                            buf = (uint8_t*)realloc(buf, bufsize);
                        }
                    }

                    e = list_remove(handle->file->stale_list, e);
                    free(item);
                }
            }

            gather_staleblocks = false;
            if (count) {
                char *doc_key = alca(char, 32);
                struct docio_object doc;

                // store count
                _count = _endian_encode(count);
                memcpy(buf + count_location - sizeof(_count), &_count, sizeof(_count));

                // append a system doc
                memset(&doc, 0x0, sizeof(doc));
                // add one to 'revnum' to get the next revision number
                // (note that filemgr_mutex() is grabbed so that no other thread
                //  will change the 'revnum').
                sprintf(doc_key, "stale_blocks_%" _F64, revnum);
                doc.key = (void*)doc_key;
                doc.body = buf;
                doc.length.keylen = strlen(doc_key) + 1;
                doc.length.metalen = 0;
                doc.length.bodylen = offset;
                doc.seqnum = 0;
                doc_offset = docio_append_doc_system(handle->dhandle, &doc);

                // insert into stale-block tree
                _doc_offset = _endian_encode(doc_offset);
                btree_insert(handle->staletree, (void *)&_revnum, (void *)&_doc_offset);
                btreeblk_end(handle->bhandle);
                btreeblk_reset_subblock_info(handle->bhandle);

                if (from_mergetree && first_loop) {
                    // if from_mergetree flag is set and this is the first loop,
                    // stale regions in this document are already in mergetree
                    // so skip adding them into in-memory stale info tree.

                    // however, the system doc itself should be marked as stale
                    // when the doc is reclaimed, thus we instead add a dummy entry
                    // that containing doc offset, length info only.
                    fdb_add_inmem_stale_info(handle, revnum, &doc, doc_offset, true);
                } else {
                    // add the doc into in-memory stale info tree
                    fdb_add_inmem_stale_info(handle, revnum, &doc, doc_offset, false);
                }

                if (list_begin(filemgr_get_stale_list(handle->file))) {
                    // updating stale tree brings another stale blocks.
                    // recursively update until there is no more stale block.

                    // note that infinite loop will not occur because
                    // 1) all updated index blocks for stale tree are still writable
                    // 2) incoming keys for stale tree (revnum) are monotonic
                    //    increasing order; most recently allocated node will be
                    //    updated again.

                    count = 0;
                    // save previous doc offset
                    memcpy(buf, &_doc_offset, sizeof(_doc_offset));

                    // gather once again
                    gather_staleblocks = true;
                }
            }

            first_loop = false;
        } // gather stale blocks

        delta = handle->bhandle->nlivenodes - stat.nlivenodes;
        _kvs_stat_update_attr(handle->file, 0, KVS_STAT_NLIVENODES, delta);
        delta = handle->bhandle->ndeltanodes - stat.nlivenodes;
        delta *= handle->config.blocksize;
        _kvs_stat_update_attr(handle->file, 0, KVS_STAT_DELTASIZE, delta);

        free(buf);
    } else {
        btreeblk_reset_subblock_info(handle->bhandle);
    }
}